

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

void * HUF_alignUpWorkspace(void *workspace,size_t *workspaceSizePtr,size_t align)

{
  ulong uVar1;
  uint __line;
  void *pvVar2;
  char *__assertion;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = align - 1;
  if ((align & uVar1) == 0) {
    uVar3 = align - (uVar1 & (ulong)workspace) & uVar1;
    pvVar2 = (void *)0x0;
    sVar4 = 0;
    if (*workspaceSizePtr < uVar3) {
LAB_001f7f27:
      *workspaceSizePtr = sVar4;
      return pvVar2;
    }
    if (align == 0) {
      __assertion = "add < align";
      __line = 0x79;
    }
    else {
      pvVar2 = (void *)((long)workspace + uVar3);
      sVar4 = *workspaceSizePtr - uVar3;
      if ((uVar1 & (ulong)pvVar2) == 0) goto LAB_001f7f27;
      __assertion = "((size_t)aligned & mask) == 0";
      __line = 0x7a;
    }
  }
  else {
    __assertion = "(align & (align - 1)) == 0";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                ,__line,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
}

Assistant:

static void* HUF_alignUpWorkspace(void* workspace, size_t* workspaceSizePtr, size_t align)
{
    size_t const mask = align - 1;
    size_t const rem = (size_t)workspace & mask;
    size_t const add = (align - rem) & mask;
    BYTE* const aligned = (BYTE*)workspace + add;
    assert((align & (align - 1)) == 0); /* pow 2 */
    assert(align <= HUF_WORKSPACE_MAX_ALIGNMENT);
    if (*workspaceSizePtr >= add) {
        assert(add < align);
        assert(((size_t)aligned & mask) == 0);
        *workspaceSizePtr -= add;
        return aligned;
    } else {
        *workspaceSizePtr = 0;
        return NULL;
    }
}